

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestResult
               (ostream *stream,TestResult *result)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  string *__return_storage_ptr___00;
  TestPartResult *pTVar1;
  ostream *poVar2;
  uint line;
  internal *piVar3;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  int i;
  int iVar6;
  undefined1 local_d0 [8];
  string location;
  string summary;
  string detail;
  allocator<char> local_45;
  int local_44;
  ostream *local_40;
  int local_34;
  
  local_34 = 0;
  iVar6 = 0;
  local_40 = stream;
  for (i = 0; pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (&summary.field_2._M_allocated_capacity + 1),
      i < (int)(((long)(result->test_part_results_).
                       super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(result->test_part_results_).
                      super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x70); i = i + 1) {
    pTVar1 = TestResult::GetTestPartResult(result,i);
    line = pTVar1->type_ - kNonFatalFailure;
    if (line < 2) {
      if (iVar6 == 0 && local_34 == 0) {
        std::operator<<(local_40,">\n");
      }
      piVar3 = (internal *)(pTVar1->file_name_)._M_string_length;
      if (piVar3 != (internal *)0x0) {
        piVar3 = (internal *)(pTVar1->file_name_)._M_dataplus._M_p;
      }
      FormatCompilerIndependentFileLocation_abi_cxx11_
                ((string *)local_d0,piVar3,(char *)(ulong)(uint)pTVar1->line_number_,line);
      std::operator+(pbVar5,(string *)local_d0,"\n");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&location.field_2 + 8),pbVar5,(pTVar1->summary_)._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)pbVar5);
      poVar2 = std::operator<<(local_40,"      <failure message=\"");
      EscapeXmlAttribute(pbVar5,(string *)((long)&location.field_2 + 8));
      local_44 = i;
      poVar2 = std::operator<<(poVar2,(string *)pbVar5);
      std::operator<<(poVar2,"\" type=\"\">");
      std::__cxx11::string::~string((string *)pbVar5);
      __return_storage_ptr__ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (&detail.field_2._M_allocated_capacity + 1);
      std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                     "\n");
      std::operator+(pbVar5,__return_storage_ptr__,(pTVar1->message_)._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
      RemoveInvalidXmlCharacters(__return_storage_ptr__,pbVar5);
      stream = local_40;
      OutputXmlCDataSection(local_40,(char *)detail.field_2._8_8_);
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
      std::operator<<(stream,"</failure>\n");
      std::__cxx11::string::~string((string *)(summary.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(location.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_d0);
      i = local_44;
      iVar6 = iVar6 + 1;
    }
    else {
      stream = local_40;
      if (pTVar1->type_ == kSkip) {
        if (local_34 == 0 && iVar6 == 0) {
          std::operator<<(local_40,">\n");
        }
        piVar3 = (internal *)(pTVar1->file_name_)._M_string_length;
        if (piVar3 != (internal *)0x0) {
          piVar3 = (internal *)(pTVar1->file_name_)._M_dataplus._M_p;
        }
        FormatCompilerIndependentFileLocation_abi_cxx11_
                  ((string *)local_d0,piVar3,(char *)(ulong)(uint)pTVar1->line_number_,line);
        std::operator+(pbVar5,(string *)local_d0,"\n");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&location.field_2 + 8),pbVar5,(pTVar1->summary_)._M_dataplus._M_p);
        local_44 = iVar6;
        std::__cxx11::string::~string((string *)pbVar5);
        poVar2 = std::operator<<(local_40,"      <skipped message=\"");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(detail.field_2._M_local_buf + 8),(char *)location.field_2._8_8_,
                   &local_45);
        __return_storage_ptr___00 = (string *)(&summary.field_2._M_allocated_capacity + 1);
        EscapeXmlAttribute(__return_storage_ptr___00,(string *)(detail.field_2._M_local_buf + 8));
        poVar2 = std::operator<<(poVar2,(string *)__return_storage_ptr___00);
        std::operator<<(poVar2,"\">");
        std::__cxx11::string::~string((string *)__return_storage_ptr___00);
        pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (&detail.field_2._M_allocated_capacity + 1);
        std::__cxx11::string::~string((string *)pbVar5);
        std::operator+(pbVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_d0,"\n");
        std::operator+(__return_storage_ptr___00,pbVar5,(pTVar1->message_)._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)pbVar5);
        RemoveInvalidXmlCharacters(pbVar5,__return_storage_ptr___00);
        stream = local_40;
        OutputXmlCDataSection(local_40,(char *)detail.field_2._8_8_);
        std::__cxx11::string::~string((string *)pbVar5);
        std::operator<<(stream,"</skipped>\n");
        local_34 = local_34 + 1;
        std::__cxx11::string::~string((string *)__return_storage_ptr___00);
        std::__cxx11::string::~string((string *)(location.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_d0);
        iVar6 = local_44;
      }
    }
  }
  if (iVar6 == 0 && local_34 == 0) {
    if ((int)((ulong)((long)(result->test_properties_).
                            super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(result->test_properties_).
                           super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 6) == 0) {
      pcVar4 = " />\n";
      goto LAB_00115a75;
    }
    std::operator<<(stream,">\n");
  }
  OutputXmlTestProperties(stream,result);
  pcVar4 = "    </testcase>\n";
LAB_00115a75:
  std::operator<<(stream,pcVar4);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestResult(::std::ostream* stream,
                                                   const TestResult& result) {
  int failures = 0;
  int skips = 0;
  for (int i = 0; i < result.total_part_count(); ++i) {
    const TestPartResult& part = result.GetTestPartResult(i);
    if (part.failed()) {
      if (++failures == 1 && skips == 0) {
        *stream << ">\n";
      }
      const std::string location =
          internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                          part.line_number());
      const std::string summary = location + "\n" + part.summary();
      *stream << "      <failure message=\""
              << EscapeXmlAttribute(summary)
              << "\" type=\"\">";
      const std::string detail = location + "\n" + part.message();
      OutputXmlCDataSection(stream, RemoveInvalidXmlCharacters(detail).c_str());
      *stream << "</failure>\n";
    } else if (part.skipped()) {
      if (++skips == 1 && failures == 0) {
        *stream << ">\n";
      }
      const std::string location =
          internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                          part.line_number());
      const std::string summary = location + "\n" + part.summary();
      *stream << "      <skipped message=\""
              << EscapeXmlAttribute(summary.c_str()) << "\">";
      const std::string detail = location + "\n" + part.message();
      OutputXmlCDataSection(stream, RemoveInvalidXmlCharacters(detail).c_str());
      *stream << "</skipped>\n";
    }
  }

  if (failures == 0 && skips == 0 && result.test_property_count() == 0) {
    *stream << " />\n";
  } else {
    if (failures == 0 && skips == 0) {
      *stream << ">\n";
    }
    OutputXmlTestProperties(stream, result);
    *stream << "    </testcase>\n";
  }
}